

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cpp
# Opt level: O1

void __thiscall Solver::solveBFS(Solver *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  string *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pBVar4;
  Block block;
  Block block_00;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  bool bVar13;
  bool bVar14;
  iterator iVar15;
  mapped_type *pmVar16;
  ulong uVar17;
  Solver *pSVar18;
  ulong uVar19;
  int iVar20;
  deque<Board,_std::allocator<Board>_> boards;
  Board tempBoard;
  Board board;
  _Deque_base<Board,_std::allocator<Board>_> local_508;
  Board local_4b8;
  undefined1 local_3d0 [144];
  key_type local_340;
  undefined1 *local_320;
  undefined1 auStack_310 [16];
  vector<Block,_std::allocator<Block>_> local_300;
  Board local_2e8;
  Board local_200;
  Board local_118;
  
  local_508._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_508._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_508._M_impl.super__Deque_impl_data._M_finish._M_cur = (Board *)0x0;
  local_508._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_508._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_508._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_508._M_impl.super__Deque_impl_data._M_start._M_cur = (Board *)0x0;
  local_508._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_508._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_508._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Board,_std::allocator<Board>_>::_M_initialize_map(&local_508,0);
  std::deque<Board,_std::allocator<Board>_>::push_back
            ((deque<Board,_std::allocator<Board>_> *)&local_508,&this->board);
  __k = &local_4b8.identifier;
  paVar2 = &local_4b8.referrer.field_2;
  paVar3 = &local_4b8.identifier.field_2;
  this_00 = &this->pastSteps;
  p_Var1 = &(this->pastSteps)._M_t._M_impl.super__Rb_tree_header;
  do {
    if (local_508._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_508._M_impl.super__Deque_impl_data._M_start._M_cur) break;
    Board::Board((Board *)local_3d0,local_508._M_impl.super__Deque_impl_data._M_start._M_cur);
    std::deque<Board,_std::allocator<Board>_>::pop_front
              ((deque<Board,_std::allocator<Board>_> *)&local_508);
    bVar13 = Board::isCompleted((Board *)local_3d0);
    if (bVar13) {
      Board::Board(&local_2e8,(Board *)local_3d0);
      constructSolutionSteps(this,&local_2e8);
      if (local_2e8.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e8.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8.referrer._M_dataplus._M_p != &local_2e8.referrer.field_2) {
        operator_delete(local_2e8.referrer._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8.identifier._M_dataplus._M_p != &local_2e8.identifier.field_2) {
        operator_delete(local_2e8.identifier._M_dataplus._M_p);
      }
    }
    else {
      if (local_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar19 = 0;
        do {
          bVar14 = Block::isHorizontal(local_300.super__Vector_base<Block,_std::allocator<Block>_>.
                                       _M_impl.super__Vector_impl_data._M_start + uVar19);
          if (bVar14) {
            iVar20 = 0;
            do {
              pBVar4 = local_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar19;
              uVar5 = pBVar4->id;
              uVar6 = pBVar4->row;
              uVar7 = pBVar4->column;
              uVar8 = pBVar4->length;
              block.length = uVar8;
              block.column = uVar7;
              block.row = uVar6;
              block.id = uVar5;
              block.direction =
                   local_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar19].direction;
              bVar14 = Board::canMove((Board *)local_3d0,block,iVar20);
              if (bVar14) {
                pSVar18 = (Solver *)local_3d0;
                Board::Board(&local_118,(Board *)local_3d0);
                createMovedInstance(&local_4b8,pSVar18,&local_118,(int)uVar19,iVar20);
                if (local_118.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_118.blocks.super__Vector_base<Block,_std::allocator<Block>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.referrer._M_dataplus._M_p != &local_118.referrer.field_2) {
                  operator_delete(local_118.referrer._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118.identifier._M_dataplus._M_p != &local_118.identifier.field_2) {
                  operator_delete(local_118.identifier._M_dataplus._M_p);
                }
                iVar15 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                         ::find(&this_00->_M_t,__k);
                if ((_Rb_tree_header *)iVar15._M_node == p_Var1) {
                  pmVar16 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                            ::operator[](this_00,__k);
                  memcpy(pmVar16,&local_4b8,0x90);
                  std::__cxx11::string::_M_assign((string *)&pmVar16->identifier);
                  std::__cxx11::string::_M_assign((string *)&pmVar16->referrer);
                  std::vector<Block,_std::allocator<Block>_>::operator=
                            (&pmVar16->blocks,&local_4b8.blocks);
                  std::deque<Board,_std::allocator<Board>_>::push_back
                            ((deque<Board,_std::allocator<Board>_> *)&local_508,&local_4b8);
                }
                if (local_4b8.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_4b8.blocks.super__Vector_base<Block,_std::allocator<Block>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4b8.referrer._M_dataplus._M_p != paVar2) {
                  operator_delete(local_4b8.referrer._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4b8.identifier._M_dataplus._M_p != paVar3) {
                  operator_delete(local_4b8.identifier._M_dataplus._M_p);
                }
              }
              iVar20 = iVar20 + 1;
            } while (iVar20 == 1);
          }
          else {
            iVar20 = 2;
            do {
              pBVar4 = local_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar19;
              uVar9 = pBVar4->id;
              uVar10 = pBVar4->row;
              uVar11 = pBVar4->column;
              uVar12 = pBVar4->length;
              block_00.length = uVar12;
              block_00.column = uVar11;
              block_00.row = uVar10;
              block_00.id = uVar9;
              block_00.direction =
                   local_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar19].direction;
              bVar14 = Board::canMove((Board *)local_3d0,block_00,iVar20);
              if (bVar14) {
                pSVar18 = (Solver *)local_3d0;
                Board::Board(&local_200,(Board *)local_3d0);
                createMovedInstance(&local_4b8,pSVar18,&local_200,(int)uVar19,iVar20);
                if (local_200.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_200.blocks.super__Vector_base<Block,_std::allocator<Block>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_200.referrer._M_dataplus._M_p != &local_200.referrer.field_2) {
                  operator_delete(local_200.referrer._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_200.identifier._M_dataplus._M_p != &local_200.identifier.field_2) {
                  operator_delete(local_200.identifier._M_dataplus._M_p);
                }
                iVar15 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                         ::find(&this_00->_M_t,__k);
                if ((_Rb_tree_header *)iVar15._M_node == p_Var1) {
                  pmVar16 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                            ::operator[](this_00,__k);
                  memcpy(pmVar16,&local_4b8,0x90);
                  std::__cxx11::string::_M_assign((string *)&pmVar16->identifier);
                  std::__cxx11::string::_M_assign((string *)&pmVar16->referrer);
                  std::vector<Block,_std::allocator<Block>_>::operator=
                            (&pmVar16->blocks,&local_4b8.blocks);
                  std::deque<Board,_std::allocator<Board>_>::push_back
                            ((deque<Board,_std::allocator<Board>_> *)&local_508,&local_4b8);
                }
                if (local_4b8.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_4b8.blocks.super__Vector_base<Block,_std::allocator<Block>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4b8.referrer._M_dataplus._M_p != paVar2) {
                  operator_delete(local_4b8.referrer._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4b8.identifier._M_dataplus._M_p != paVar3) {
                  operator_delete(local_4b8.identifier._M_dataplus._M_p);
                }
              }
              iVar20 = iVar20 + 1;
            } while (iVar20 != 4);
          }
          uVar19 = uVar19 + 1;
          uVar17 = ((long)local_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
        } while (uVar19 <= uVar17 && uVar17 - uVar19 != 0);
      }
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                ::operator[](this_00,&local_340);
      memcpy(pmVar16,(Solver *)local_3d0,0x90);
      std::__cxx11::string::_M_assign((string *)&pmVar16->identifier);
      std::__cxx11::string::_M_assign((string *)&pmVar16->referrer);
      std::vector<Block,_std::allocator<Block>_>::operator=(&pmVar16->blocks,&local_300);
    }
    if (local_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_320 != auStack_310) {
      operator_delete(local_320);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p);
    }
  } while (!bVar13);
  std::deque<Board,_std::allocator<Board>_>::~deque
            ((deque<Board,_std::allocator<Board>_> *)&local_508);
  return;
}

Assistant:

void Solver::solveBFS() {
    deque<Board> boards;
    boards.push_back(this->board);

    // Loop over the queue until either the queue is empty or the solution is found.
    while (!boards.empty()) {

        // Get the next board and remove it from the list.
        Board board = boards.front();
        boards.pop_front();

        // Check if the board is solved completely.
        if (board.isCompleted()) {

            // The board is completed construct the solution steps.
            this->constructSolutionSteps(board);
            return;
        }

        // Construct the possible movement boards and push to the queue.
        for (int i = 0; i < board.blocks.size(); ++i) {
            if (board.blocks[i].isHorizontal()) {
                for (int j = LEFT; j <= RIGHT; ++j) {
                    // If the board can move, create the moved instance with appropriate referrer and identifier numbers.
                    if (board.canMove(board.blocks[i], j)) {
                        Board tempBoard = this->createMovedInstance(board, i, j);
                        if (this->pastSteps.find(tempBoard.identifier) == this->pastSteps.end()) {
                            this->pastSteps[tempBoard.identifier] = tempBoard;
                            boards.push_back(tempBoard);
                        }
                    }
                }
            } else {
                for (int j = UP; j <= DOWN; ++j) {
                    // If the board can move, create the moved instance with appropriate referrer and identifier numbers.
                    if (board.canMove(board.blocks[i], j)) {
                        Board tempBoard = this->createMovedInstance(board, i, j);
                        if (this->pastSteps.find(tempBoard.identifier) == this->pastSteps.end()) {
                            this->pastSteps[tempBoard.identifier] = tempBoard;
                            boards.push_back(tempBoard);
                        }
                    }
                }
            }
        }

        // Move the board to the past steps.
        this->pastSteps[board.identifier] = board;
    }
}